

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  ImSpan<signed_char> *this;
  ImSpan<ImGuiTableColumn> *this_00;
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  char cVar5;
  byte bVar6;
  undefined2 uVar7;
  ImGuiWindow *pIVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  int iVar13;
  ImU32 id;
  ulong uVar14;
  char *pcVar15;
  ImGuiTableColumn *pIVar16;
  ImGuiTableColumn *pIVar17;
  byte *pbVar18;
  short sVar19;
  uint uVar20;
  int iVar21;
  int order_n;
  ulong uVar22;
  int order_n_1;
  int iVar23;
  int iVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float local_b8;
  ImGuiContext *g;
  ImRect host_clip_rect;
  ImRect local_40;
  
  pIVar9 = GImGui;
  if (table->IsLayoutLocked != false) {
    __assert_fail("table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                  ,0x2145,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  fVar28 = table->CellPaddingX2;
  fVar1 = (table->WorkRect).Min.x;
  fVar2 = (table->WorkRect).Min.y;
  fVar27 = (table->WorkRect).Max.x;
  fVar29 = table->CellSpacingX;
  fVar25 = (pIVar9->Style).FramePadding.x * 3.0;
  table->LeftMostStretchedColumnDisplayOrder = -1;
  table->ColumnsAutoFitWidth = 0.0;
  this = &table->DisplayOrderToIndex;
  this_00 = &table->Columns;
  fVar26 = 0.0;
  local_b8 = 0.0;
  fVar31 = 0.0;
  for (uVar22 = 0; uVar14 = (ulong)table->ColumnsCount, (long)uVar22 < (long)uVar14;
      uVar22 = uVar22 + 1) {
    if ((table->VisibleMaskByDisplayOrder >> (uVar22 & 0x3f) & 1) != 0) {
      pcVar15 = ImSpan<signed_char>::operator[](this,(int)uVar22);
      cVar5 = *pcVar15;
      pIVar16 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)cVar5);
      uVar12 = TableFixColumnFlags(table,pIVar16->FlagsIn);
      uVar20 = (uint)(cVar5 != '\0') * 0x4000 + 0x4000;
      if ((uVar12 & 0xc000) != 0) {
        uVar20 = 0;
      }
      uVar20 = uVar20 | uVar12;
      pIVar16->Flags = uVar20;
      uVar12 = table->Flags;
      if ((uVar12 & 8) != 0) {
        TableFixColumnSortDirection(pIVar16);
        uVar12 = table->Flags;
        uVar20 = pIVar16->Flags;
      }
      uVar7 = pIVar16->ContentWidthRowsFrozen;
      sVar19 = pIVar16->ContentWidthRowsUnfrozen;
      if (pIVar16->ContentWidthRowsUnfrozen < (short)uVar7) {
        sVar19 = uVar7;
      }
      fVar26 = (float)(int)sVar19;
      if ((uVar20 & 0x800) == 0 && (uVar12 & 0x8000) == 0) {
        uVar12 = -(uint)((float)(int)pIVar16->ContentWidthHeadersIdeal <= fVar26);
        fVar26 = (float)((uint)fVar26 & uVar12 |
                        ~uVar12 & (uint)(float)(int)pIVar16->ContentWidthHeadersIdeal);
      }
      fVar26 = fVar26 + fVar28;
      uVar12 = -(uint)(fVar25 <= fVar26);
      fVar30 = (float)(~uVar12 & (uint)fVar25 | (uint)fVar26 & uVar12);
      fVar26 = table->ColumnsAutoFitWidth + fVar30;
      table->ColumnsAutoFitWidth = fVar26;
      if ((uVar20 & 0x14) == 0) {
        if ((uVar20 & 8) == 0) {
          __assert_fail("column->Flags & ImGuiTableColumnFlags_WidthStretch",
                        "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                        ,0x2187,"void ImGui::TableUpdateLayout(ImGuiTable *)");
        }
        fVar30 = pIVar16->WidthStretchWeight;
        if (fVar30 < 0.0) {
          pIVar16->WidthStretchWeight = 1.0;
          fVar30 = 1.0;
        }
        fVar31 = fVar31 + fVar30;
        if (table->LeftMostStretchedColumnDisplayOrder == -1) {
          table->LeftMostStretchedColumnDisplayOrder = pIVar16->DisplayOrder;
        }
      }
      else {
        if ((char)((uVar20 & 0x10) >> 4) == '\0' && pIVar16->AutoFitQueue == '\0') {
          fVar30 = pIVar16->WidthRequest;
        }
        else {
          pIVar16->WidthRequest = fVar30;
          if (('\x01' < pIVar16->AutoFitQueue) && (table->IsInitializing == true)) {
            uVar20 = -(uint)(fVar25 * 4.0 <= fVar30);
            fVar30 = (float)(~uVar20 & (uint)(fVar25 * 4.0) | uVar20 & (uint)fVar30);
            pIVar16->WidthRequest = fVar30;
          }
        }
        local_b8 = local_b8 + fVar30;
      }
    }
  }
  fVar28 = (float)(table->ColumnsVisibleCount + -1);
  table->ColumnsAutoFitWidth = fVar29 * 3.0 * fVar28 + fVar26;
  fVar28 = fVar28 * table->CellSpacingX;
  if ((((table->Flags & 0x40000) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth))) {
    fVar27 = fVar27 - fVar1;
  }
  else {
    fVar27 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  fVar27 = (fVar27 - fVar28) - local_b8;
  table->ColumnsTotalWidth = fVar28;
  iVar21 = 0;
  local_b8 = fVar27;
  for (uVar22 = 0; (long)uVar22 < (long)(int)uVar14; uVar22 = uVar22 + 1) {
    if ((table->VisibleMaskByDisplayOrder >> (uVar22 & 0x3f) & 1) != 0) {
      pcVar15 = ImSpan<signed_char>::operator[](this,(int)uVar22);
      pIVar16 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)*pcVar15);
      if ((pIVar16->Flags & 8) != 0) {
        fVar28 = (pIVar16->WidthStretchWeight / fVar31) * fVar27;
        uVar20 = -(uint)(fVar25 <= fVar28);
        fVar28 = (float)(int)((float)(~uVar20 & (uint)fVar25 | (uint)fVar28 & uVar20) + 0.01);
        pIVar16->WidthRequest = fVar28;
        local_b8 = local_b8 - fVar28;
        if (pIVar16->NextVisibleColumn != -1) {
          pIVar17 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)pIVar16->NextVisibleColumn);
          if ((pIVar17->Flags & 4U) != 0) {
            pIVar16->Flags = pIVar16->Flags | pIVar17->Flags & 0x100000U;
          }
        }
      }
      if (pIVar16->NextVisibleColumn == -1) {
        uVar20 = pIVar16->Flags;
        if (table->LeftMostStretchedColumnDisplayOrder != -1) {
          uVar20 = uVar20 | 0x100000;
          pIVar16->Flags = uVar20;
        }
      }
      else {
        uVar20 = pIVar16->Flags;
      }
      iVar21 = iVar21 + (uint)((uVar20 & 0x20) == 0);
      uVar20 = -(uint)(fVar25 <= pIVar16->WidthRequest);
      fVar28 = (float)(int)(float)(~uVar20 & (uint)fVar25 | (uint)pIVar16->WidthRequest & uVar20);
      pIVar16->WidthGiven = fVar28;
      table->ColumnsTotalWidth = fVar28 + table->ColumnsTotalWidth;
      uVar14 = (ulong)(uint)table->ColumnsCount;
    }
  }
  if ((1.0 <= local_b8) && (0.0 < fVar31)) {
    uVar14 = uVar14 & 0xffffffff;
    do {
      uVar22 = uVar14 & 0xffffffff;
      do {
        do {
          uVar14 = uVar14 - 1;
          if ((local_b8 < 1.0) || ((int)uVar22 < 1)) goto LAB_001d1f75;
          uVar20 = (int)uVar22 - 1;
          uVar22 = (ulong)uVar20;
        } while ((table->VisibleMaskByDisplayOrder >> (uVar14 & 0x3f) & 1) == 0);
        pcVar15 = ImSpan<signed_char>::operator[](this,uVar20);
        pIVar16 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)*pcVar15);
      } while ((pIVar16->Flags & 8) == 0);
      uVar3 = pIVar16->WidthRequest;
      uVar4 = pIVar16->WidthGiven;
      pIVar16->WidthRequest = (float)uVar3 + 1.0;
      pIVar16->WidthGiven = (float)uVar4 + 1.0;
      local_b8 = local_b8 + -1.0;
    } while( true );
  }
LAB_001d1f75:
  local_40.Max.x = (table->OuterRect).Max.x;
  fVar28 = (table->OuterRect).Max.y;
  local_40.Min.x = (table->OuterRect).Min.x;
  local_40.Min.y = (table->OuterRect).Min.y;
  fVar27 = local_40.Min.y + table->LastOuterHeight;
  uVar20 = -(uint)(fVar27 <= fVar28);
  local_40.Max.y = (float)(uVar20 & (uint)fVar28 | ~uVar20 & (uint)fVar27);
  iVar24 = 0;
  bVar10 = ItemHoverable(&local_40,0);
  fVar28 = fVar1;
  if ('\0' < table->FreezeColumnsCount) {
    fVar28 = (table->OuterRect).Min.x;
  }
  host_clip_rect.Min = (table->InnerClipRect).Min;
  host_clip_rect.Max = (table->InnerClipRect).Max;
  uVar22 = 0;
  iVar23 = 0;
  do {
    if ((long)table->ColumnsCount <= (long)uVar22) {
      if ((bVar10) && (table->HoveredColumnBody == -1)) {
        fVar28 = (table->WorkRect).Min.x;
        if (table->RightMostVisibleColumn != -1) {
          pIVar16 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)table->RightMostVisibleColumn)
          ;
          fVar1 = (pIVar16->ClipRect).Max.x;
          uVar20 = -(uint)(fVar1 <= fVar28);
          fVar28 = (float)(uVar20 & (uint)fVar28 | ~uVar20 & (uint)fVar1);
        }
        if (fVar28 <= (pIVar9->IO).MousePos.x) {
          table->HoveredColumnBody = (ImS8)table->ColumnsCount;
        }
      }
      if ((iVar21 == 0) && ((table->Flags & 1U) != 0)) {
        table->Flags = table->Flags & 0xfffffffe;
      }
      TableUpdateDrawChannels(table);
      if ((table->Flags & 1) != 0) {
        TableUpdateBorders(table);
      }
      table->LastFirstRowHeight = 0.0;
      table->IsLayoutLocked = true;
      table->IsUsingHeaders = false;
      if ((table->IsContextPopupOpen == true) &&
         (table->InstanceCurrent == table->InstanceInteracted)) {
        id = ImHashStr("##ContextMenu",0,table->ID);
        bVar10 = BeginPopupEx(id,0x141);
        if (bVar10) {
          TableDrawContextMenu(table);
          EndPopup();
        }
        else {
          table->IsContextPopupOpen = false;
        }
      }
      pIVar8 = table->InnerWindow;
      if ((table->Flags & 0x1000) == 0) {
        ImDrawList::PushClipRect
                  (pIVar8->DrawList,(pIVar8->ClipRect).Min,(pIVar8->ClipRect).Max,false);
      }
      else {
        ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar8->DrawList,1);
      }
      if ((table->IsSortSpecsDirty == true) && ((table->Flags & 8) != 0)) {
        TableSortSpecsBuild(table);
      }
      return;
    }
    pbVar18 = (byte *)ImSpan<signed_char>::operator[](this,(int)uVar22);
    bVar6 = *pbVar18;
    pIVar16 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)(char)bVar6);
    if (iVar23 == table->FreezeColumnsCount && '\0' < table->FreezeColumnsCount) {
      fVar28 = fVar28 + (fVar1 - (table->OuterRect).Min.x);
    }
    if ((table->VisibleMaskByDisplayOrder >> (uVar22 & 0x3f) & 1) == 0) {
      pIVar16->MaxX = fVar28;
      pIVar16->MinX = fVar28;
      pIVar16->StartXHeaders = fVar28;
      pIVar16->StartXRows = fVar28;
      pIVar16->WidthGiven = 0.0;
      (pIVar16->ClipRect).Min.x = fVar28;
      (pIVar16->ClipRect).Min.y = fVar2;
      (pIVar16->ClipRect).Max.x = fVar28;
      (pIVar16->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar16->ClipRect,&host_clip_rect);
      pIVar16->IsClipped = true;
      pIVar16->SkipItems = true;
    }
    else {
      if (((uint)table->Flags >> 0x12 & 1) == 0) {
        fVar27 = 3.4028235e+38;
        if (((uint)table->Flags >> 0x11 & 1) == 0) {
          iVar13 = ~(int)pIVar16->IndexWithinVisibleSet + table->ColumnsVisibleCount;
          fVar27 = (table->WorkRect).Max.x;
LAB_001d2147:
          fVar27 = fVar27 - (float)iVar13 * fVar25;
        }
      }
      else {
        fVar27 = 3.4028235e+38;
        if ((long)uVar22 < (long)table->FreezeColumnsRequest) {
          iVar13 = table->FreezeColumnsRequest + iVar24;
          fVar27 = (table->InnerClipRect).Max.x;
          goto LAB_001d2147;
        }
      }
      fVar29 = pIVar16->WidthGiven + fVar28;
      if (fVar27 < fVar29) {
        uVar20 = -(uint)(fVar25 <= fVar27 - fVar28);
        fVar29 = (float)(~uVar20 & (uint)fVar25 | (uint)(fVar27 - fVar28) & uVar20);
        pIVar16->WidthGiven = fVar29;
        fVar29 = fVar29 + fVar28;
      }
      pIVar16->MinX = fVar28;
      pIVar16->MaxX = fVar29;
      (pIVar16->ClipRect).Min.x = fVar28;
      (pIVar16->ClipRect).Min.y = fVar2;
      (pIVar16->ClipRect).Max.x = fVar29;
      (pIVar16->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar16->ClipRect,&host_clip_rect);
      fVar27 = (pIVar16->ClipRect).Min.x;
      if ((fVar27 < (pIVar16->ClipRect).Max.x) || ((pIVar16->AutoFitQueue & 1U) != 0)) {
        pIVar16->IsClipped = false;
      }
      else {
        pIVar16->IsClipped = (bool)(~pIVar16->CannotSkipItemsQueue & 1);
        if ((pIVar16->CannotSkipItemsQueue & 1U) == 0) {
          table->VisibleUnclippedMaskByIndex =
               table->VisibleUnclippedMaskByIndex &
               (-2L << (bVar6 & 0x3f) | 0xfffffffffffffffeU >> 0x40 - (bVar6 & 0x3f));
        }
      }
      bVar11 = true;
      if (pIVar16->IsVisible == true) {
        bVar11 = table->HostSkipItems;
      }
      pIVar16->SkipItems = bVar11;
      if (((bVar10) && (fVar29 = (pIVar9->IO).MousePos.x, fVar27 <= fVar29)) &&
         (fVar29 < (pIVar16->ClipRect).Max.x)) {
        table->HoveredColumnBody = bVar6;
      }
      fVar27 = pIVar16->MinX + table->CellPaddingX1;
      pIVar16->StartXRows = fVar27;
      pIVar16->StartXHeaders = fVar27;
      pIVar16->ContentMaxPosRowsFrozen = fVar27;
      pIVar16->ContentMaxPosRowsUnfrozen = fVar27;
      pIVar16->ContentMaxPosHeadersIdeal = fVar27;
      pIVar16->ContentMaxPosHeadersUsed = fVar27;
      if (table->HostSkipItems == false) {
        pIVar16->AutoFitQueue = pIVar16->AutoFitQueue >> 1;
        pIVar16->CannotSkipItemsQueue = pIVar16->CannotSkipItemsQueue >> 1;
      }
      if (iVar23 < table->FreezeColumnsCount) {
        fVar27 = pIVar16->MaxX + 2.0;
        uVar20 = -(uint)(fVar27 <= host_clip_rect.Min.x);
        host_clip_rect.Min.x = (float)(~uVar20 & (uint)fVar27 | (uint)host_clip_rect.Min.x & uVar20)
        ;
      }
      fVar28 = fVar28 + pIVar16->WidthGiven + table->CellSpacingX;
      iVar23 = iVar23 + 1;
    }
    uVar22 = uVar22 + 1;
    iVar24 = iVar24 + -1;
  } while( true );
}

Assistant:

void    ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;

    // Compute offset, clip rect for the frame
    // (can't make auto padding larger than what WorkRect knows about so right-alignment matches)
    const ImRect work_rect = table->WorkRect;
    const float padding_auto_x = table->CellPaddingX2;
    const float spacing_auto_x = table->CellSpacingX * (1.0f + 2.0f); // CellSpacingX is >0.0f when there's no vertical border, in which case we add two extra CellSpacingX to make auto-fit look nice instead of cramped. We may want to expose this somehow.
    const float min_column_width = TableGetMinColumnWidth();

    int count_fixed = 0;
    float sum_weights_stretched = 0.0f;     // Sum of all weights for weighted columns.
    float sum_width_fixed_requests = 0.0f;  // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns.
    table->LeftMostStretchedColumnDisplayOrder = -1;
    table->ColumnsAutoFitWidth = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Adjust flags: default width mode + weighted columns are not allowed when auto extending
        // FIXME-TABLE: Clarify why we need to do this again here and not just in TableSetupColumn()
        column->Flags = TableFixColumnFlags(table, column->FlagsIn);
        if ((column->Flags & ImGuiTableColumnFlags_IndentMask_) == 0)
            column->Flags |= (column_n == 0) ? ImGuiTableColumnFlags_IndentEnable : ImGuiTableColumnFlags_IndentDisable;

        // We have a unusual edge case where if the user doesn't call TableGetSortSpecs() but has sorting enabled
        // or varying sorting flags, we still want the sorting arrows to honor those flags.
        if (table->Flags & ImGuiTableFlags_Sortable)
            TableFixColumnSortDirection(column);

        // Calculate "ideal" column width for nothing to be clipped.
        // Combine width from regular rows + width from headers unless requested not to.
        const float column_content_width_rows = (float)ImMax(column->ContentWidthRowsFrozen, column->ContentWidthRowsUnfrozen);
        const float column_content_width_headers = (float)column->ContentWidthHeadersIdeal;
        float column_width_ideal = column_content_width_rows;
        if (!(table->Flags & ImGuiTableFlags_NoHeadersWidth) && !(column->Flags & ImGuiTableColumnFlags_NoHeaderWidth))
            column_width_ideal = ImMax(column_width_ideal, column_content_width_headers);
        column_width_ideal = ImMax(column_width_ideal + padding_auto_x, min_column_width);
        table->ColumnsAutoFitWidth += column_width_ideal;

        if (column->Flags & (ImGuiTableColumnFlags_WidthAlwaysAutoResize | ImGuiTableColumnFlags_WidthFixed))
        {
            // Latch initial size for fixed columns
            count_fixed += 1;
            const bool auto_fit = (column->AutoFitQueue != 0x00) || (column->Flags & ImGuiTableColumnFlags_WidthAlwaysAutoResize);
            if (auto_fit)
            {
                column->WidthRequest = column_width_ideal;

                // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
                // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
                // large height (= first frame scrollbar display very off + clipper would skip lots of items).
                // This is merely making the side-effect less extreme, but doesn't properly fixes it.
                // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
                if (column->AutoFitQueue > 0x01 && table->IsInitializing)
                    column->WidthRequest = ImMax(column->WidthRequest, min_column_width * 4.0f);
            }
            sum_width_fixed_requests += column->WidthRequest;
        }
        else
        {
            IM_ASSERT(column->Flags & ImGuiTableColumnFlags_WidthStretch);
            const int init_size = (column->WidthStretchWeight < 0.0f);
            if (init_size)
                column->WidthStretchWeight = 1.0f;
            sum_weights_stretched += column->WidthStretchWeight;
            if (table->LeftMostStretchedColumnDisplayOrder == -1)
                table->LeftMostStretchedColumnDisplayOrder = (ImS8)column->DisplayOrder;
        }
    }

    // CellSpacingX is >0.0f when there's no vertical border, in which case we add two extra CellSpacingX to make auto-fit look nice instead of cramped.
    // We may want to expose this somehow.
    table->ColumnsAutoFitWidth += spacing_auto_x * (table->ColumnsVisibleCount - 1);

    // Layout
    const float width_spacings = table->CellSpacingX * (table->ColumnsVisibleCount - 1);
    float width_avail;
    if ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f)
        width_avail = table->InnerClipRect.GetWidth() - width_spacings;
    else
        width_avail = work_rect.GetWidth() - width_spacings;
    const float width_avail_for_stretched_columns = width_avail - sum_width_fixed_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;

    // Apply final width based on requested widths
    // Mark some columns as not resizable
    int count_resizable = 0;
    table->ColumnsTotalWidth = width_spacings;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];

        // Allocate width for stretched/weighted columns
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            // WidthStretchWeight gets converted into WidthRequest
            float weight_ratio = column->WidthStretchWeight / sum_weights_stretched;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, min_column_width) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;

            // [Resize Rule 2] Resizing from right-side of a weighted column preceding a fixed column
            // needs to forward resizing to left-side of fixed column. We also need to copy the NoResize flag..
            if (column->NextVisibleColumn != -1)
                if (ImGuiTableColumn* next_column = &table->Columns[column->NextVisibleColumn])
                    if (next_column->Flags & ImGuiTableColumnFlags_WidthFixed)
                        column->Flags |= (next_column->Flags & ImGuiTableColumnFlags_NoDirectResize_);
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // (see comments in TableResizeColumn())
        if (column->NextVisibleColumn == -1 && table->LeftMostStretchedColumnDisplayOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        if (!(column->Flags & ImGuiTableColumnFlags_NoResize))
            count_resizable++;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, min_column_width));
        table->ColumnsTotalWidth += column->WidthGiven;
    }

#if 0
    const float width_excess = table->ColumnsTotalWidth - work_rect.GetWidth();
    if ((table->Flags & ImGuiTableFlags_SizingPolicyStretchX) && width_excess > 0.0f)
    {
        // Shrink widths when the total does not fit
        // FIXME-TABLE: This is working but confuses/conflicts with manual resizing.
        // FIXME-TABLE: Policy to shrink down below below ideal/requested width if there's no room?
        g.ShrinkWidthBuffer.resize(table->ColumnsVisibleCount);
        for (int order_n = 0, visible_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            const int column_n = table->DisplayOrder[order_n];
            g.ShrinkWidthBuffer[visible_n].Index = column_n;
            g.ShrinkWidthBuffer[visible_n].Width = table->Columns[column_n].WidthGiven;
            visible_n++;
        }
        ShrinkWidths(g.ShrinkWidthBuffer.Data, g.ShrinkWidthBuffer.Size, width_excess);
        for (int n = 0; n < g.ShrinkWidthBuffer.Size; n++)
            table->Columns[g.ShrinkWidthBuffer.Data[n].Index].WidthGiven = ImMax(g.ShrinkWidthBuffer.Data[n].Width, min_column_size);
        // FIXME: Need to alter table->ColumnsTotalWidth
    }
    else
#endif

    // Redistribute remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor), could be adjusted depending
    // on where the mouse cursor is and/or relative weights.
    // FIXME-TABLE: May be simpler to store floating width and floor final positions only
    // FIXME-TABLE: Make it optional? User might prefer to preserve pixel perfect same size?
    if (width_remaining_for_stretched_columns >= 1.0f)
        for (int order_n = table->ColumnsCount - 1; sum_weights_stretched > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    // Detect hovered column
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // Setup final position, offset and clipping rectangles
    int visible_n = 0;
    float offset_x = (table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x;
    ImRect host_clip_rect = table->InnerClipRect;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        if (table->FreezeColumnsCount > 0 && table->FreezeColumnsCount == visible_n)
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;

        if ((table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = offset_x;
            column->StartXRows = column->StartXHeaders = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.x = offset_x;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.x = offset_x;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsClipped = column->SkipItems = true;
            continue;
        }

        float max_x = FLT_MAX;
        if (table->Flags & ImGuiTableFlags_ScrollX)
        {
            // Frozen columns can't reach beyond visible width else scrolling will naturally break.
            if (order_n < table->FreezeColumnsRequest)
                max_x = table->InnerClipRect.Max.x - (table->FreezeColumnsRequest - order_n) * min_column_width;
        }
        else
        {
            // If horizontal scrolling if disabled, we apply a final lossless shrinking of columns in order to make
            // sure they are all visible. Because of this we also know that all of the columns will always fit in
            // table->WorkRect and therefore in table->InnerRect (because ScrollX is off)
            if (!(table->Flags & ImGuiTableFlags_NoKeepColumnsVisible))
                max_x = table->WorkRect.Max.x - (table->ColumnsVisibleCount - (column->IndexWithinVisibleSet + 1)) * min_column_width;
        }
        if (offset_x + column->WidthGiven > max_x)
            column->WidthGiven = ImMax(max_x - offset_x, min_column_width);

        column->MinX = offset_x;
        column->MaxX = column->MinX + column->WidthGiven;

        //// A one pixel padding on the right side makes clipping more noticeable and contents look less cramped.
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX;// -1.0f;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        column->IsClipped = (column->ClipRect.Max.x <= column->ClipRect.Min.x) && (column->AutoFitQueue & 1) == 0 && (column->CannotSkipItemsQueue & 1) == 0;
        if (column->IsClipped)
            table->VisibleUnclippedMaskByIndex &= ~((ImU64)1 << column_n);  // Columns with the _WidthAlwaysAutoResize sizing policy will never be updated then.

        column->SkipItems = !column->IsVisible || table->HostSkipItems;

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImS8)column_n;

        // Starting cursor position
        column->StartXRows = column->StartXHeaders = column->MinX + table->CellPaddingX1;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->StartXRows = ImMax(column->StartXRows, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->StartXRows = ImLerp(column->StartXRows, ImMax(column->StartXRows, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        const float initial_max_pos_x = column->MinX + table->CellPaddingX1;
        column->ContentMaxPosRowsFrozen = column->ContentMaxPosRowsUnfrozen = initial_max_pos_x;
        column->ContentMaxPosHeadersUsed = column->ContentMaxPosHeadersIdeal = initial_max_pos_x;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImMax(host_clip_rect.Min.x, column->MaxX + 2.0f);

        offset_x += column->WidthGiven + table->CellSpacingX;
        visible_n++;
    }

    // Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        float unused_x1 = table->WorkRect.Min.x;
        if (table->RightMostVisibleColumn != -1)
            unused_x1 = ImMax(unused_x1, table->Columns[table->RightMostVisibleColumn].ClipRect.Max.x);
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImS8)table->ColumnsCount;
    }

    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag,
    // either because of using _WidthAlwaysAutoResize/_WidthStretch).
    // This will hide the resizing option from the context menu.
    if (count_resizable == 0 && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // Allocate draw channels
    TableUpdateDrawChannels(table);

    // Borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);

    // Reset fields after we used them in TableSetupResize()
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClipX)
        table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, 1);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);

    // Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);
}